

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O2

bool ImPlot::DragLineY(char *id,double *value,bool show_label,ImVec4 *col,float thickness)

{
  float fVar1;
  float fVar2;
  double dVar3;
  int iVar4;
  ImPlotPlot *pIVar5;
  ImGuiWindow *pIVar6;
  ImVec2 IVar7;
  float fVar8;
  ImPlotContext *pIVar9;
  undefined1 auVar10 [16];
  bool bVar11;
  ImU32 col_00;
  ImU32 fg;
  ImDrawList *this;
  ulong uVar12;
  float thickness_00;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar13;
  float fVar14;
  double dVar15;
  ImPlotPoint IVar16;
  float local_c4;
  ImVec2 local_b0;
  undefined1 local_a8 [16];
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  double *local_80;
  char *local_78;
  ImVec2 local_70;
  char buff [32];
  ImVec4 color;
  
  pIVar9 = GImPlot;
  pIVar5 = GImPlot->CurrentPlot;
  if (pIVar5 == (ImPlotPlot *)0x0) {
    __assert_fail("(gp.CurrentPlot != __null) && \"DragLineY() needs to be called between BeginPlot() and EndPlot()!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                  ,0xb43,
                  "bool ImPlot::DragLineY(const char *, double *, bool, const ImVec4 &, float)");
  }
  local_a8._0_4_ = thickness;
  fVar8 = 5.0;
  if (5.0 <= thickness) {
    fVar8 = thickness;
  }
  local_c4 = (pIVar5->PlotRect).Min.x;
  fVar1 = (pIVar5->PlotRect).Max.x;
  IVar7 = PlotToPixels(0.0,*value,-1);
  fVar14 = IVar7.y;
  local_98 = (float)(int)(fVar14 + 0.5);
  fStack_94 = (float)(int)fVar14;
  fStack_90 = (float)(int)fVar14;
  fStack_8c = (float)(int)fVar14;
  fVar14 = fVar8 * 0.5;
  if (((pIVar9->CurrentPlot->PlotRect).Min.y - fVar14 <= local_98) &&
     (local_98 <= (pIVar9->CurrentPlot->PlotRect).Max.y + fVar14)) {
    fVar2 = (pIVar9->Style).MajorTickLen.y;
    local_80 = value;
    local_78 = id;
    if ((col->w == -1.0) && (!NAN(col->w))) {
      col = ImGui::GetStyleColorVec4(0);
    }
    color.x = col->x;
    color.y = col->y;
    color.z = col->z;
    color.w = col->w;
    col_00 = ImGui::ColorConvertFloat4ToU32(&color);
    this = ImGui::GetWindowDrawList();
    PushPlotClipRect(0.0);
    buff._4_4_ = local_98;
    local_b0.y = local_98;
    local_b0.x = fVar1;
    buff._0_4_ = local_c4;
    ImDrawList::AddLine(this,(ImVec2 *)buff,&local_b0,col_00,(float)local_a8._0_4_);
    buff._4_4_ = local_98;
    local_b0.x = local_c4 + fVar2;
    local_b0.y = local_98;
    thickness_00 = (float)local_a8._0_4_ * 3.0;
    local_a8._0_4_ = thickness_00;
    buff._0_4_ = local_c4;
    ImDrawList::AddLine(this,(ImVec2 *)buff,&local_b0,col_00,thickness_00);
    buff._4_4_ = local_98;
    local_b0.x = fVar1 - fVar2;
    local_b0.y = local_98;
    buff._0_4_ = fVar1;
    ImDrawList::AddLine(this,(ImVec2 *)buff,&local_b0,col_00,(float)local_a8._0_4_);
    ImGui::PopClipRect();
    if ((pIVar9->CurrentPlot->Selecting == false) && (pIVar9->CurrentPlot->Querying == false)) {
      IVar7 = ImGui::GetCursorScreenPos();
      local_a8._8_4_ = extraout_XMM0_Dc;
      local_a8._0_4_ = IVar7.x;
      local_a8._4_4_ = IVar7.y;
      local_a8._12_4_ = extraout_XMM0_Dd;
      fVar14 = local_98 - fVar14;
      ImGui::SetItemAllowOverlap();
      pIVar6 = GImGui->CurrentWindow;
      pIVar6->WriteAccessed = true;
      (pIVar6->DC).CursorPos.x = local_c4;
      (pIVar6->DC).CursorPos.y = fVar14;
      buff._0_4_ = fVar1 - local_c4;
      buff._4_4_ = fVar8;
      ImGui::InvisibleButton(local_78,(ImVec2 *)buff,0);
      auVar10 = local_a8;
      pIVar6 = GImGui->CurrentWindow;
      pIVar6->WriteAccessed = true;
      (pIVar6->DC).CursorPos.x = (float)local_a8._0_4_;
      (pIVar6->DC).CursorPos.y = (float)local_a8._4_4_;
      iVar4 = GImPlot->CurrentPlot->CurrentYAxis;
      local_a8 = auVar10;
      bVar11 = ImGui::IsItemHovered(0);
      if ((bVar11) || (bVar11 = ImGui::IsItemActive(), bVar11)) {
        pIVar9->CurrentPlot->PlotHovered = false;
        ImGui::SetMouseCursor(3);
        if (show_label) {
          LabelAxisValue(pIVar9->CurrentPlot->YAxis + iVar4,pIVar9->YTicks + iVar4,*local_80,buff,
                         0x20);
          if (iVar4 != 0) {
            local_c4 = fVar1;
          }
          local_b0.x = local_c4;
          local_b0.y = local_98;
          local_70.x = 0.0;
          local_70.y = 0.0;
          fg = CalcTextColor(&color);
          ImPlotAnnotationCollection::Append
                    (&pIVar9->Annotations,&local_b0,&local_70,col_00,fg,true,"%s = %s",local_78,
                     (ImVec2 *)buff);
        }
      }
      bVar11 = ImGui::IsItemActive();
      if (bVar11) {
        bVar11 = ImGui::IsMouseDragging(0,-1.0);
        if (!bVar11) {
          return false;
        }
        IVar16 = GetPlotMousePos(-1);
        dVar13 = IVar16.y;
        *local_80 = dVar13;
        dVar3 = pIVar9->CurrentPlot->YAxis[iVar4].Range.Min;
        dVar15 = pIVar9->CurrentPlot->YAxis[iVar4].Range.Max;
        if (dVar13 <= dVar15) {
          dVar15 = dVar13;
        }
        uVar12 = -(ulong)(dVar13 < dVar3);
        *local_80 = (double)(~uVar12 & (ulong)dVar15 | (ulong)dVar3 & uVar12);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool DragLineY(const char* id, double* value, bool show_label, const ImVec4& col, float thickness) {
    ImPlotContext& gp = *GImPlot;
    IM_ASSERT_USER_ERROR(gp.CurrentPlot != NULL, "DragLineY() needs to be called between BeginPlot() and EndPlot()!");
    const float grab_size = ImMax(5.0f, thickness);
    float xl = gp.CurrentPlot->PlotRect.Min.x;
    float xr = gp.CurrentPlot->PlotRect.Max.x;
    float y  = IM_ROUND(PlotToPixels(0, *value).y);
    const bool outside = y < (gp.CurrentPlot->PlotRect.Min.y - grab_size / 2) || y > (gp.CurrentPlot->PlotRect.Max.y + grab_size / 2);
    if (outside)
        return false;
    float len = gp.Style.MajorTickLen.y;
    ImVec4 color = IsColorAuto(col) ? ImGui::GetStyleColorVec4(ImGuiCol_Text) : col;
    ImU32 col32 = ImGui::ColorConvertFloat4ToU32(color);
    ImDrawList& DrawList = *GetPlotDrawList();
    PushPlotClipRect();
    DrawList.AddLine(ImVec2(xl,y), ImVec2(xr,y),     col32, thickness);
    DrawList.AddLine(ImVec2(xl,y), ImVec2(xl+len,y), col32, 3*thickness);
    DrawList.AddLine(ImVec2(xr,y), ImVec2(xr-len,y), col32, 3*thickness);
    PopPlotClipRect();
    if (gp.CurrentPlot->Selecting || gp.CurrentPlot->Querying)
        return false;
    ImVec2 old_cursor_pos = ImGui::GetCursorScreenPos();
    ImVec2 new_cursor_pos = ImVec2(xl, y - grab_size / 2.0f);
    ImGui::SetItemAllowOverlap();
    ImGui::GetCurrentWindow()->DC.CursorPos = new_cursor_pos;
    ImGui::InvisibleButton(id, ImVec2(xr - xl, grab_size));
    ImGui::GetCurrentWindow()->DC.CursorPos = old_cursor_pos;
    int yax = GetCurrentYAxis();
    if (ImGui::IsItemHovered() || ImGui::IsItemActive()) {
        gp.CurrentPlot->PlotHovered = false;
        ImGui::SetMouseCursor(ImGuiMouseCursor_ResizeNS);
        if (show_label) {
            char buff[32];
            LabelAxisValue(gp.CurrentPlot->YAxis[yax], gp.YTicks[yax], *value, buff, 32);
            gp.Annotations.Append(ImVec2(yax == 0 ? xl : xr,y), ImVec2(0,0), col32, CalcTextColor(color), true,  "%s = %s", id, buff);
        }
    }
    bool dragging = false;
    if (ImGui::IsItemActive() && ImGui::IsMouseDragging(0)) {
        *value = ImPlot::GetPlotMousePos().y;
        *value = ImClamp(*value, gp.CurrentPlot->YAxis[yax].Range.Min, gp.CurrentPlot->YAxis[yax].Range.Max);
        dragging = true;
    }
    return dragging;
}